

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

void hrgls::datablob::DataBlobSourceThread(DataBlobSource_private *info)

{
  StreamCallback p_Var1;
  void *pvVar2;
  pthread_mutex_t *__mutex;
  pointer __src;
  uint8_t *data;
  size_t i;
  long lVar3;
  ulong __n;
  timeval val;
  hrgls_DataBlob blob;
  DataBlob blobpp;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  vector<char,_std::allocator<char>_> blobToSend;
  duration<long,_std::ratio<1L,_1000L>_> local_88;
  DataBlob local_80;
  pthread_mutex_t *local_78;
  float local_6c;
  list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_> *local_68;
  pthread_mutex_t *local_60;
  long local_58;
  double local_50;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if (info != (DataBlobSource_private *)0x0) {
    local_58 = std::chrono::_V2::system_clock::now();
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      local_88.__r._0_1_ = (char)lVar3;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)&local_48,(char *)&local_88);
    }
    local_60 = (pthread_mutex_t *)&info->callbackMutex;
    local_78 = (pthread_mutex_t *)&info->storedBlobsMutex;
    local_68 = &info->storedBlobs;
    do {
      if (info->running == true) {
        lVar3 = std::chrono::_V2::system_clock::now();
        local_50 = StreamProperties::Rate(&info->properties);
        local_6c = (float)(lVar3 - local_58) / 1e+09;
        val = API::GetCurrentSystemTime(info->api);
        if (1.0 / local_50 < (double)local_6c) {
          hrgls_DataBlobCreate((hrgls_DataBlob *)&local_88);
          hrgls_DataBlobSetTime((hrgls_DataBlob)local_88.__r,val);
          __src = local_48._M_impl.super__Vector_impl_data._M_start;
          __n = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start;
          data = (uint8_t *)operator_new__(__n);
          memcpy(data,__src,__n);
          hrgls_DataBlobSetData
                    ((hrgls_DataBlob)local_88.__r,data,(uint32_t)__n,myDelete,(void *)0x0);
          __mutex = local_60;
          std::mutex::lock((mutex *)&local_60->__data);
          p_Var1 = info->callbackHandler;
          pvVar2 = info->callbackUserData;
          pthread_mutex_unlock(__mutex);
          DataBlob::DataBlob(&local_80,(hrgls_DataBlob)local_88.__r);
          hrgls_DataBlobDestroy((hrgls_DataBlob)local_88.__r);
          if (p_Var1 == (StreamCallback)0x0) {
            std::mutex::lock((mutex *)&local_78->__data);
            std::__cxx11::
            list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::push_back
                      (local_68,&local_80);
            pthread_mutex_unlock(local_78);
          }
          else {
            (*p_Var1)(&local_80,pvVar2);
          }
          DataBlob::~DataBlob(&local_80);
        }
      }
      local_88.__r = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_88);
    } while (info->quitThread != true);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

static void DataBlobSourceThread(DataBlobSource::DataBlobSource_private *info)
    {
      if (!info) { return; }

      // Keeps track of how long since we sent a blob
      auto lastBlob = std::chrono::system_clock::now();

      // Make the data we're going to send.
      std::vector<char> blobToSend;
      for (size_t i = 0; i < 256; i++) {
        blobToSend.push_back(i % 256);
      }

      do {
        // See if we are streaming.
        if (info->running) {
          // See if it is time to create a new blob.
          auto now = std::chrono::system_clock::now();
          std::chrono::duration<float> dt = now - lastBlob;
          double interval = 1.0 / info->properties.Rate();
          timeval myTime = info->api->GetCurrentSystemTime();
          if (dt.count() > interval) {

            // Create a blob
            hrgls_DataBlob blob;
            hrgls_DataBlobCreate(&blob);
            hrgls_DataBlobSetTime(blob, myTime);

            // Copy the DataBlob data, make a copy, and set the deleter function for it.
            uint8_t *data = new uint8_t[blobToSend.size()];
            memcpy(data, blobToSend.data(), blobToSend.size());
            hrgls_DataBlobSetData(blob, data, static_cast<uint32_t>(blobToSend.size()),
              myDelete, nullptr);

            // Need to guard the access to the callback handler and userdata with a
            // mutex so that we don't get half of the information due to a race with the
            // main thread.
            StreamCallback callbackHandler;
            void *callbackUserData;
            {
              std::lock_guard<std::mutex> lock(info->callbackMutex);
              callbackHandler = info->callbackHandler;
              callbackUserData = info->callbackUserData;
            }

            // If we have a callback handler, call it.  If not, queue the DataBlob
            // for later delivery.
            DataBlob blobpp(blob);
            hrgls_DataBlobDestroy(blob);
            if (callbackHandler) {
              callbackHandler(blobpp, callbackUserData);
            } else {
              // Store a blob with a copy of the data onto the front of the queue for
              // GetNextBlob.
              std::lock_guard<std::mutex> lock(info->storedBlobsMutex);
              info->storedBlobs.push_back(blobpp);
            }
          } // if time for a new blob

        } // if running

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
      } while (!info->quitThread);
    }